

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::
CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::GL> *this
          )

{
  CallLogWrapper *this_00;
  GLsizei GVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  GLuint GVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_type __n;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferTest;
  CColorArray bufferRef2;
  CColorArray bufferRef1;
  DIResult result;
  allocator_type local_559;
  string local_558;
  string local_538;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_518;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_500;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4e8;
  uint local_4cc [3];
  undefined8 local_4c0;
  undefined1 local_4b8 [4];
  undefined1 auStack_4b4 [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [23];
  long local_338;
  DILogger local_328;
  DILogger local_1a8;
  
  local_558._M_string_length = (size_type)local_558._M_dataplus._M_p;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_558._M_dataplus._M_p = (pointer)((long)&local_558 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,0x1af8059);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar5 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_4b8,&local_558,&local_538,true);
  this->_program = GVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if (local_558._M_dataplus._M_p != (pointer)((long)&local_558 + 0x10)) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_4b8 != local_4a8) {
    operator_delete(_local_4b8,local_4a8[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar8 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_558._M_dataplus._M_p = (pointer)0x0;
    local_558._M_string_length = 0;
    local_558.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_558);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_558._M_string_length - (long)local_558._M_dataplus._M_p,
               local_558._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    __n = (long)(local_558._M_string_length - (long)local_558._M_dataplus._M_p) >> 4;
    local_4cc[0] = (uint)(__n >> 1) & 0x7fffffff;
    local_4cc[1] = 1;
    local_4c0 = 0;
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_4b4;
    _local_4b8 = (float  [4])(auVar4 << 0x20);
    local_4cc[2] = local_4cc[0];
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_538,__n,
               (value_type_conflict4 *)local_4b8,(allocator_type *)&local_4e8);
    auVar4 = _DAT_019f5ce0;
    if (local_538._M_string_length - (long)local_538._M_dataplus._M_p != 0) {
      lVar8 = (long)(local_538._M_string_length - (long)local_538._M_dataplus._M_p) >> 2;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar9 = lVar8 + -1;
      auVar11._8_4_ = (int)lVar9;
      auVar11._0_8_ = lVar9;
      auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar11 = auVar11 ^ _DAT_019f5ce0;
      auVar12 = _DAT_019fcc00;
      do {
        auVar13 = auVar12 ^ auVar4;
        if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                    auVar11._4_4_ < auVar13._4_4_) & 1)) {
          *(int *)(local_538._M_dataplus._M_p + uVar10 * 4) = (int)uVar10;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          *(int *)(local_538._M_dataplus._M_p + uVar10 * 4 + 4) = (int)uVar10 + 1;
        }
        uVar10 = uVar10 + 2;
        lVar9 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar9 + 2;
      } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,local_4cc,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,local_538._M_string_length - (long)local_538._M_dataplus._M_p,
               local_538._M_dataplus._M_p,0x88e4);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)CONCAT44(extraout_var,iVar6);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4b8 = (undefined1  [4])0x0;
    auStack_4b4._0_4_ = 0.0;
    auStack_4b4._4_4_ = 0.0;
    auStack_4b4._8_4_ = 0.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4e8,(long)((iVar6 * *(int *)(CONCAT44(extraout_var_00,iVar7) + 4)) / 2),
               (value_type *)local_4b8,(allocator_type *)&local_500);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)CONCAT44(extraout_var_01,iVar6);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    auStack_4b4._4_4_ = 0.3;
    auStack_4b4._8_4_ = 1.0;
    local_4b8 = (undefined1  [4])0x3dcccccd;
    auStack_4b4._0_4_ = 0.2;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_500,(long)((iVar6 * *(int *)(CONCAT44(extraout_var_02,iVar7) + 4)) / 2),
               (value_type *)local_4b8,(allocator_type *)&local_518);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)CONCAT44(extraout_var_03,iVar6);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4b8 = (undefined1  [4])0x0;
    auStack_4b4._0_4_ = 0.0;
    auStack_4b4._4_4_ = 0.0;
    auStack_4b4._8_4_ = 0.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_518,(long)(iVar6 * *(int *)(CONCAT44(extraout_var_04,iVar7) + 4)),
               (value_type *)local_4b8,&local_559);
    auVar13[0xf] = 0;
    auVar13._0_15_ = stack0xfffffffffffffb49;
    _local_4b8 = (float  [4])(auVar13 << 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_4b4 + 4));
    local_338 = 0;
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar1 = *(GLsizei *)CONCAT44(extraout_var_05,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,GVar1,*(int *)(CONCAT44(extraout_var_06,iVar6) + 4) / 2,0x1908,0x1406,
               local_518.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar2 = *(uint *)CONCAT44(extraout_var_07,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)(CONCAT44(extraout_var_08,iVar6) + 4);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_09,iVar7);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                       ->m_renderCtx,&local_518,uVar2,iVar6 / 2,&local_4e8,uVar3,
                       *(int *)(CONCAT44(extraout_var_10,iVar7) + 4) / 2);
    DIResult::sub_result(&local_1a8,(DIResult *)local_4b8,lVar8);
    DILogger::~DILogger(&local_1a8);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)(CONCAT44(extraout_var_11,iVar6) + 4);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar1 = *(GLsizei *)CONCAT44(extraout_var_12,iVar7);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,(iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1,GVar1,
               *(int *)(CONCAT44(extraout_var_13,iVar7) + 4) / 2,0x1908,0x1406,
               local_518.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar2 = *(uint *)CONCAT44(extraout_var_14,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)(CONCAT44(extraout_var_15,iVar6) + 4);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_16,iVar7);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar8 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)
                       ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)
                       ->m_renderCtx,&local_518,uVar2,iVar6 / 2,&local_500,uVar3,
                       *(int *)(CONCAT44(extraout_var_17,iVar7) + 4) / 2);
    DIResult::sub_result(&local_328,(DIResult *)local_4b8,lVar8);
    DILogger::~DILogger(&local_328);
    lVar8 = local_338;
    DILogger::~DILogger((DILogger *)local_4b8);
    if (local_518.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_518.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_518.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_518.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_500.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_500.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_500.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_500.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4e8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_538._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_538._M_dataplus._M_p,
                      local_538.field_2._M_allocated_capacity - (long)local_538._M_dataplus._M_p);
    }
    if (local_558._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_558._M_dataplus._M_p,
                      local_558.field_2._M_allocated_capacity - (long)local_558._M_dataplus._M_p);
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size()) / 2;
		indirectElements.primCount					 = 1;
		indirectElements.baseVertex					 = 0;
		indirectElements.firstIndex					 = static_cast<GLuint>(coords.size()) / 2;
		indirectElements.reservedMustBeZero			 = 0;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);

		CColorArray bufferRef1(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef1,
										 getWindowWidth(), getWindowHeight() / 2));

		ReadPixelsFloat<api>(0, (getWindowHeight() + 1) / 2, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef2,
										 getWindowWidth(), getWindowHeight() / 2));

		return result.code();
	}